

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

int ncnn::binary_op_scalar_inplace_pack8<ncnn::binary_op_mul_pack8>(Mat *a,float b,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  binary_op_mul_pack8 *this;
  long in_RDI;
  uint in_XMM0_Da;
  undefined8 uVar3;
  undefined1 auVar4 [32];
  undefined8 uVar5;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  __m256 _b;
  int size;
  int channels;
  int h;
  int w;
  binary_op_mul_pack8 op;
  __m256 *in_stack_fffffffffffffe40;
  __m256 *in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe68;
  Mat *in_stack_fffffffffffffe70;
  int local_17c;
  Mat local_178;
  binary_op_mul_pack8 *local_130;
  int local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  binary_op_mul_pack8 *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  Mat *pMStack_b0;
  undefined8 uStack_a8;
  binary_op_mul_pack8 *local_90;
  undefined1 local_80 [32];
  
  local_e8 = *(int *)(in_RDI + 0x2c);
  local_ec = *(int *)(in_RDI + 0x30);
  local_f0 = *(int *)(in_RDI + 0x38);
  local_f4 = local_e8 * local_ec;
  auVar1 = vinsertps_avx(ZEXT416(in_XMM0_Da),ZEXT416(in_XMM0_Da),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(in_XMM0_Da),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416(in_XMM0_Da),0x30);
  auVar2 = vinsertps_avx(ZEXT416(in_XMM0_Da),ZEXT416(in_XMM0_Da),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(in_XMM0_Da),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416(in_XMM0_Da),0x30);
  auVar4._16_16_ = auVar1;
  auVar4._0_16_ = auVar2;
  local_80._0_8_ = auVar2._0_8_;
  local_80._8_8_ = auVar2._8_8_;
  local_80._16_8_ = auVar1._0_8_;
  local_80._24_8_ = auVar1._8_8_;
  local_120 = local_80._0_8_;
  uStack_118 = local_80._8_8_;
  uStack_110 = local_80._16_8_;
  uStack_108 = local_80._24_8_;
  local_80 = auVar4;
  for (local_124 = 0; local_124 < local_f0; local_124 = local_124 + 1) {
    Mat::channel(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
    this = (binary_op_mul_pack8 *)Mat::operator_cast_to_float_(&local_178);
    Mat::~Mat((Mat *)0x607b74);
    local_130 = this;
    for (local_17c = 0; local_17c < local_f4; local_17c = local_17c + 1) {
      local_c8 = local_130;
      uVar3 = *(undefined8 *)local_130;
      in_stack_fffffffffffffe68 = *(undefined8 *)(local_130 + 8);
      in_stack_fffffffffffffe70 = *(Mat **)(local_130 + 0x10);
      uVar5 = *(undefined8 *)(local_130 + 0x18);
      binary_op_mul_pack8::operator()(this,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      local_90 = local_130;
      *(undefined8 *)local_130 = uVar3;
      *(undefined8 *)(local_130 + 8) = in_stack_fffffffffffffe68;
      *(Mat **)(local_130 + 0x10) = in_stack_fffffffffffffe70;
      *(undefined8 *)(local_130 + 0x18) = uVar5;
      local_130 = local_130 + 0x20;
      local_c0 = uVar3;
      uStack_b8 = in_stack_fffffffffffffe68;
      pMStack_b0 = in_stack_fffffffffffffe70;
      uStack_a8 = uVar5;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar_inplace_pack8(Mat& a, float b, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int channels = a.c;
    int size = w * h;

    __m256 _b = _mm256_set1_ps(b);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        for (int i = 0; i < size; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op(_p, _b);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
    }

    return 0;
}